

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O1

ConfidentialTxOutReference * __thiscall
cfd::ConfidentialTransactionController::AddTxOut
          (ConfidentialTxOutReference *__return_storage_ptr__,
          ConfidentialTransactionController *this,ElementsConfidentialAddress *address,Amount *value
          ,ConfidentialAssetId *asset,bool remove_nonce)

{
  pointer puVar1;
  uint32_t index;
  ByteData hash_data;
  Script locking_script;
  ElementsConfidentialAddress confidential_addr;
  string local_288;
  ByteData local_268;
  ConfidentialKey local_248;
  ByteData local_230;
  Script local_218;
  undefined1 local_1e0 [432];
  
  core::ElementsConfidentialAddress::GetHash(&local_230,address);
  core::ElementsConfidentialAddress::GetLockingScript(&local_218,address);
  core::ByteData::ByteData(&local_268);
  if (!remove_nonce) {
    core::ElementsConfidentialAddress::GetAddress_abi_cxx11_(&local_288,address);
    core::ElementsConfidentialAddress::ElementsConfidentialAddress
              ((ElementsConfidentialAddress *)local_1e0,&local_288);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != &local_288.field_2) {
      operator_delete(local_288._M_dataplus._M_p);
    }
    core::ElementsConfidentialAddress::GetConfidentialKey
              (&local_248,(ElementsConfidentialAddress *)local_1e0);
    core::Pubkey::GetData((ByteData *)&local_288,&local_248);
    puVar1 = local_268.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    local_268.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_288._M_dataplus._M_p;
    local_268.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_288._M_string_length;
    local_268.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_288.field_2._M_allocated_capacity;
    local_288._M_dataplus._M_p = (pointer)0x0;
    local_288._M_string_length = 0;
    local_288.field_2._M_allocated_capacity = 0;
    if (puVar1 != (pointer)0x0) {
      operator_delete(puVar1);
    }
    if (local_288._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_288._M_dataplus._M_p);
    }
    if (local_248.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_248.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    core::ElementsConfidentialAddress::~ElementsConfidentialAddress
              ((ElementsConfidentialAddress *)local_1e0);
  }
  core::ConfidentialNonce::ConfidentialNonce((ConfidentialNonce *)local_1e0,&local_268);
  index = core::ConfidentialTransaction::AddTxOut
                    (&this->transaction_,value,asset,&local_218,(ConfidentialNonce *)local_1e0);
  core::ConfidentialTransaction::GetTxOut(__return_storage_ptr__,&this->transaction_,index);
  local_1e0._0_8_ = &PTR__ConfidentialNonce_007356c0;
  if ((pointer)local_1e0._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_1e0._8_8_);
  }
  if (local_268.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_268.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  core::Script::~Script(&local_218);
  if (local_230.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_230.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

const ConfidentialTxOutReference ConfidentialTransactionController::AddTxOut(
    const ElementsConfidentialAddress& address, const Amount& value,
    const ConfidentialAssetId& asset, bool remove_nonce) {
  const ByteData hash_data = address.GetHash();
  Script locking_script = address.GetLockingScript();

  ByteData nonce;
  if (!remove_nonce) {
    ElementsConfidentialAddress confidential_addr(address.GetAddress());
    nonce = confidential_addr.GetConfidentialKey().GetData();
  }
  return AddTxOut(locking_script, value, asset, ConfidentialNonce(nonce));
}